

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_> *
testing::internal::
ActionResultHolder<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>::
PerformAction<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>(unsigned_int)>
          (Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
           *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  *this_00;
  tuple<unsigned_int> local_4c;
  Result local_48;
  ReferenceOrValueWrapper<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_30;
  tuple<unsigned_int> *local_18;
  ArgumentTuple *args_local;
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
             *)operator_new(0x20);
  this = args_local;
  std::tuple<unsigned_int>::tuple(&local_4c,local_18);
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::Perform(&local_48,
            (Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
             *)this,&local_4c);
  ReferenceOrValueWrapper<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  ::ReferenceOrValueWrapper(&local_30,&local_48);
  ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  ::ActionResultHolder(this_00,&local_30);
  ReferenceOrValueWrapper<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  ::~ReferenceOrValueWrapper(&local_30);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector(&local_48);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }